

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.h
# Opt level: O1

bool mdns::query(int fd,sockaddr_in *address)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  time_t tVar5;
  int *piVar6;
  ssize_t sVar7;
  ostream *poVar8;
  char *__s;
  size_t sVar9;
  int iVar10;
  long lVar11;
  socklen_t addressSize;
  string packet;
  string name;
  timeval tv;
  fd_set fds;
  sockaddr_storage addressStorage;
  int local_1ac;
  socklen_t local_1a8;
  int local_1a4;
  sockaddr_in *local_1a0;
  long local_198;
  ulong local_190;
  string local_188;
  string local_168;
  timeval local_148;
  fd_set local_138;
  sockaddr local_b0 [8];
  
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  local_1a0 = address;
  std::__cxx11::string::_M_construct((ulong)&local_188,'\0');
  local_1a8 = 0x80;
  tVar5 = time((time_t *)0x0);
  lVar11 = tVar5 + 10;
  iVar10 = fd + 0x3f;
  if (-1 < fd) {
    iVar10 = fd;
  }
  local_190 = 1L << ((byte)fd & 0x3f);
  local_198 = (long)(iVar10 >> 6);
  local_1ac = fd + 1;
  iVar10 = 0;
  local_1a4 = local_1ac;
  do {
    tVar5 = time((time_t *)0x0);
    if (lVar11 < tVar5) {
      if (s_verbose == '\x01') {
        puts("\x1b[2K\r - Timeout waiting for mdns response, sending a new");
      }
      sendRequest(fd);
      tVar5 = time((time_t *)0x0);
      lVar11 = tVar5 + 10;
      iVar10 = iVar10 + 1;
    }
    else {
      local_138.fds_bits[0xe] = 0;
      local_138.fds_bits[0xf] = 0;
      local_138.fds_bits[0xc] = 0;
      local_138.fds_bits[0xd] = 0;
      local_138.fds_bits[10] = 0;
      local_138.fds_bits[0xb] = 0;
      local_138.fds_bits[8] = 0;
      local_138.fds_bits[9] = 0;
      local_138.fds_bits[6] = 0;
      local_138.fds_bits[7] = 0;
      local_138.fds_bits[4] = 0;
      local_138.fds_bits[5] = 0;
      local_138.fds_bits[2] = 0;
      local_138.fds_bits[3] = 0;
      local_138.fds_bits[0] = 0;
      local_138.fds_bits[1] = 0;
      local_138.fds_bits[local_198] = local_138.fds_bits[local_198] | local_190;
      local_138.fds_bits[0] = local_138.fds_bits[0] | 1;
      local_148.tv_usec = 0;
      local_148.tv_sec = 1;
      iVar3 = select(local_1a4,&local_138,(fd_set *)0x0,(fd_set *)0x0,&local_148);
      piVar6 = __errno_location();
      bVar1 = true;
      if (*piVar6 != 4) {
        if (iVar3 == 0) {
          uVar4 = (byte)(query::spinnerPos + 1) & 7;
          query::spinnerPos = (uint8_t)uVar4;
          printf("%c Waiting for response",(ulong)(uint)(int)"-\\|/-\\|/"[uVar4]);
          iVar3 = iVar10 % 10;
          if (0 < iVar3) {
            do {
              putchar(0x2e);
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
          }
          fflush(_stdout);
          printf("\x1b[2K\r");
        }
        else if (iVar3 < 0) {
          perror(" ! Error while waiting to read");
        }
        else {
          if ((local_138.fds_bits[0] & 1U) != 0) {
            uVar4 = getchar();
            if ((uVar4 == 0x71) || (uVar4 == 0x1b)) {
              puts("Aborted");
              bVar2 = false;
              local_1ac = 0;
            }
            else {
              bVar2 = true;
              if (s_verbose == '\x01') {
                printf("Unhandled key 0x%x\n",(ulong)uVar4);
              }
            }
            if (!bVar2) {
              bVar1 = false;
              goto LAB_001079f0;
            }
          }
          if ((local_138.fds_bits[local_198] & local_190) != 0) {
            sVar7 = recvfrom(fd,local_188._M_dataplus._M_p,local_188._M_string_length,0,local_b0,
                             &local_1a8);
            if (sVar7 < 0) {
              perror(" ! Failed to read packet");
              bVar1 = false;
              local_1ac = 0;
            }
            else if (local_b0[0].sa_family == 2) {
              memcpy(local_1a0,local_b0,(ulong)local_1a8);
              if (s_verbose == '\x01') {
                puts(" < Got response");
              }
              std::__cxx11::string::resize((ulong)&local_188,(char)sVar7);
              parsePacket(&local_168,&local_188);
              bVar1 = true;
              if (local_168._M_string_length != 0) {
                if (local_168._M_string_length == DAT_0012a8c0) {
                  iVar3 = bcmp(local_168._M_dataplus._M_p,queryName_abi_cxx11_,
                               local_168._M_string_length);
                  if (iVar3 == 0) {
                    local_1ac = 1;
                    bVar1 = false;
                    goto LAB_001079d4;
                  }
                }
                if (s_verbose == '\x01') {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr," - Got wrong name \'",0x13);
                  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&std::cerr,local_168._M_dataplus._M_p,
                                      local_168._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\' from ",7);
                  __s = inet_ntoa((in_addr)(local_1a0->sin_addr).s_addr);
                  if (__s == (char *)0x0) {
                    std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
                  }
                  else {
                    sVar9 = strlen(__s);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,__s,sVar9);
                  }
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                }
              }
LAB_001079d4:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                local_168.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr," ! Got wrong family, not IPv4 ",0x1e);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
            }
          }
        }
      }
LAB_001079f0:
      if (!bVar1) goto LAB_00107a09;
    }
  } while (s_running != '\x01');
  local_1ac._0_1_ = 0;
LAB_00107a09:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  return (bool)((byte)local_1ac & 1);
}

Assistant:

bool query(const int fd, sockaddr_in *address)
{
    // TODO: continously loop and update when new devices appear

    std::string packet(512, '\0');

    sockaddr_storage addressStorage;
    socklen_t addressSize = sizeof(addressStorage);

    time_t endTime = time(nullptr) + 10;
    int pingTries = 0;

    do {
        if (time(nullptr) > endTime) {
            if (s_verbose) printf("\033[2K\r - Timeout waiting for mdns response, sending a new\n");
            sendRequest(fd);
            endTime = time(nullptr) + 10;
            pingTries++;
            continue;
        }

        fd_set fds;
        FD_ZERO(&fds);
        FD_SET(fd, &fds);
        FD_SET(STDIN_FILENO, &fds);

        timeval tv = {0, 0};
        //tv.tv_usec = 100000; // 100ms, need dat nice spinner
        tv.tv_sec = 1;

        int st = select(fd+1, &fds, nullptr, nullptr, &tv);
        if (errno == EINTR) {
            continue;
        }
        if (st == 0) {
            static const char spinner[] = { '-', '\\', '|', '/', '-', '\\', '|', '/', };
            static uint8_t spinnerPos = 0;
            spinnerPos = (spinnerPos + 1) % sizeof(spinner);
            printf("%c Waiting for response", spinner[spinnerPos]);
            for (int i=0; i<pingTries % 10; i++) printf(".");
            fflush(stdout);
            printf("\033[2K\r"); // Erase the line, which won't be visible until the next flush
            continue;
        }
        if (st < 0) {
            if (errno != EINTR) {
                perror(" ! Error while waiting to read");
            }
            continue;
        }

        if (FD_ISSET(STDIN_FILENO, &fds)) {
            const int key = getchar();
            switch(key) {
            case 'q':
            case '\x1b':
                puts("Aborted");
                return false;
            default:
                if (s_verbose) printf("Unhandled key 0x%x\n", key);
                break;
            }
        }
        if (!FD_ISSET(fd, &fds)) {
            continue;
        }

        long size = recvfrom(
                fd,
                packet.data(),
                packet.size(),
                0,
                reinterpret_cast<sockaddr*>(&addressStorage),
                &addressSize
            );

        if (size < 0) {
            perror(" ! Failed to read packet");
            return false;
        }

        if (addressStorage.ss_family != AF_INET) {
            std::cerr << " ! Got wrong family, not IPv4 " << addressStorage.ss_family << std::endl;
            continue;
        }

        memcpy(address, &addressStorage, addressSize);
        if (s_verbose) {
            puts(" < Got response");
        }

        packet.resize(size);

        std::string name = parsePacket(packet);
        if (name.empty()) {
            continue;
        }
        if (name != queryName) {
            if (s_verbose) {
                std::cerr << " - Got wrong name '" << name << "' from " << inet_ntoa(address->sin_addr) << std::endl;
            }
            continue;
        }

        return true;
    } while (s_running);

    return false;
}